

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O2

void __thiscall
wasm::ReconstructStringifyWalker::transitionToInSeq(ReconstructStringifyWalker *this)

{
  pointer pOVar1;
  Function *func;
  size_t sVar2;
  ulong uVar3;
  Name name;
  Fatal local_1f0;
  undefined1 local_68 [8];
  Signature sig;
  Result<wasm::Ok> _val;
  
  pOVar1 = (this->sequences).
           super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>.
           _M_impl.super__Vector_impl_data._M_start;
  name.super_IString.str._M_str =
       *(char **)((long)&pOVar1[this->seqCounter].func.super_IString.str + 8);
  name.super_IString.str._M_len = pOVar1[this->seqCounter].func.super_IString.str._M_len;
  func = Module::getFunction((this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).
                             super_PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                             .
                             super_Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                             .currModule,name);
  IRBuilder::visitFunctionStart((Result<wasm::Ok> *)&sig.results,&this->outlinedBuilder,func);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    Fatal::Fatal(&local_1f0);
    Fatal::operator<<(&local_1f0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &sig.results);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&sig.results);
    IRBuilder::makeCall((Result<wasm::Ok> *)&sig.results,&this->existingBuilder,
                        (Name)(func->super_Importable).super_Named.name.super_IString.str,false);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      Fatal::Fatal(&local_1f0);
      Fatal::operator<<(&local_1f0,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &sig.results);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&sig.results);
      if ((this->sequences).
          super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>.
          _M_impl.super__Vector_impl_data._M_start[this->seqCounter].endsTypeUnreachable == true) {
        IRBuilder::makeUnreachable((Result<wasm::Ok> *)&sig.results,&this->existingBuilder);
        if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
          Fatal::Fatal(&local_1f0);
          Fatal::operator<<(&local_1f0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &sig.results);
          goto LAB_00a1bb6c;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&sig.results);
      }
      _local_68 = HeapType::getSignature(&func->type);
      uVar3 = 0;
      while( true ) {
        sVar2 = wasm::Type::size((Type *)local_68);
        if (sVar2 <= uVar3) {
          return;
        }
        IRBuilder::makeLocalGet
                  ((Result<wasm::Ok> *)&sig.results,&this->outlinedBuilder,(Index)uVar3);
        if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') break;
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&sig.results);
        uVar3 = (ulong)((Index)uVar3 + 1);
      }
      Fatal::Fatal(&local_1f0);
      Fatal::operator<<(&local_1f0,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &sig.results);
    }
  }
LAB_00a1bb6c:
  Fatal::~Fatal(&local_1f0);
}

Assistant:

void transitionToInSeq() {
    Function* outlinedFunc =
      getModule()->getFunction(sequences[seqCounter].func);
    ASSERT_OK(outlinedBuilder.visitFunctionStart(outlinedFunc));

    // Make a call from the existing function to the outlined function. This
    // call will replace the instructions moved to the outlined function.
    ODBG(std::cerr << "\nadding call " << outlinedFunc->name << " to "
                   << &existingBuilder << "\n");
    ASSERT_OK(existingBuilder.makeCall(outlinedFunc->name, false));

    // If the last instruction of the outlined sequence is unreachable, insert
    // an unreachable instruction immediately after the call to the outlined
    // function. This maintains the unreachable type in the original scope
    // of the outlined sequence.
    if (sequences[seqCounter].endsTypeUnreachable) {
      ODBG(std::cerr << "\nadding endsUnreachable to " << &existingBuilder
                     << "\n");
      ASSERT_OK(existingBuilder.makeUnreachable());
    }

    // Add a local.get instruction for every parameter of the outlined function.
    Signature sig = outlinedFunc->type.getSignature();
    ODBG(std::cerr << outlinedFunc->name << " takes " << sig.params.size()
                   << " parameters\n");
    for (Index i = 0; i < sig.params.size(); i++) {
      ODBG(std::cerr << "adding local.get $" << i << " to " << &outlinedBuilder
                     << "\n");
      ASSERT_OK(outlinedBuilder.makeLocalGet(i));
    }
  }